

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13ValidDNSnameConstraintsTest30<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section13ValidDNSnameConstraintsTest30
          (Section13ValidDNSnameConstraintsTest30<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13ValidDNSnameConstraintsTest30) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsDNS1CACert",
                               "ValidDNSnameConstraintsTest30EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDNS1CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.30";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}